

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O3

QPDFObjectHandle __thiscall QPDF::copyForeignObject(QPDF *this,QPDFObjectHandle *foreign)

{
  size_type *psVar1;
  pointer pQVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  bool bVar4;
  _Base_ptr p_Var5;
  mapped_type *obj_copier;
  mapped_type *pmVar6;
  const_iterator cVar7;
  long *plVar8;
  undefined8 *puVar9;
  qpdf_offset_t offset;
  string *filename;
  logic_error *this_00;
  ulong *puVar10;
  QPDFObjectHandle *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  element_type *peVar12;
  pointer this_01;
  ulong uVar13;
  undefined8 uVar14;
  QPDFObjectHandle QVar15;
  QPDFObjGen og_1;
  QPDFObjGen og;
  QPDFObjectHandle copy;
  string local_1b0;
  element_type *local_190;
  ulong *local_188;
  long local_180;
  ulong local_178;
  long lStack_170;
  string local_168;
  QPDFObjectHandle local_148;
  QPDFObjectHandle local_138;
  element_type *local_128;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_120;
  QPDFObjectHandle local_118;
  _Base_ptr local_108;
  QPDFObjectHandle *local_100;
  QPDFObjGen local_f8;
  string local_f0;
  _Base_ptr local_d0 [2];
  _Base_ptr local_c0 [2];
  undefined1 local_b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0 [7];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var11;
  
  bVar4 = QPDFObjectHandle::isIndirect(in_RDX);
  if (!bVar4) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"QPDF::copyForeign called with direct object handle");
LAB_0013b773:
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  local_b0._0_8_ = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"");
  p_Var5 = (_Base_ptr)QPDFObjectHandle::getQPDF(in_RDX,(string *)local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._0_8_ != local_a0) {
    operator_delete((void *)local_b0._0_8_,local_a0[0]._M_allocated_capacity + 1);
  }
  if (p_Var5 == (_Base_ptr)foreign) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"QPDF::copyForeign called with object from this QPDF");
    goto LAB_0013b773;
  }
  obj_copier = std::
               map<unsigned_long_long,_QPDF::ObjCopier,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_QPDF::ObjCopier>_>_>
               ::operator[]((map<unsigned_long_long,_QPDF::ObjCopier,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_QPDF::ObjCopier>_>_>
                             *)&(foreign->super_BaseHandle).obj.
                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6]
                                .qpdf,
                            (key_type_conflict *)
                            ((long)*(unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                     *)p_Var5 + 0x10));
  if ((obj_copier->visiting).
      super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl.
      super__Rb_tree_header._M_node_count != 0) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              (this_00,"obj_copier.visiting is not empty at the beginning of copyForeignObject");
    goto LAB_0013b773;
  }
  local_118.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (in_RDX->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_118.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (in_RDX->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_118.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_118.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_118.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
           _M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_118.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_118.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
           _M_use_count + 1;
    }
  }
  reserveObjects((QPDF *)foreign,&local_118,obj_copier,true);
  local_190 = (element_type *)this;
  if (local_118.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_118.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  local_108 = p_Var5;
  if ((obj_copier->visiting).
      super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl.
      super__Rb_tree_header._M_node_count != 0) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              (this_00,"obj_copier.visiting is not empty after reserving objects");
    goto LAB_0013b773;
  }
  this_01 = (obj_copier->to_copy).
            super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
            super__Vector_impl_data._M_start;
  pQVar2 = (obj_copier->to_copy).
           super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_100 = in_RDX;
  if (this_01 != pQVar2) {
    do {
      local_128 = (this_01->super_BaseHandle).obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_120 = (this_01->super_BaseHandle).obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (local_120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_120->_M_use_count = local_120->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_120->_M_use_count = local_120->_M_use_count + 1;
        }
      }
      replaceForeignIndirectObjects
                ((QPDF *)local_b0,foreign,(ObjCopier *)&local_128,SUB81(obj_copier,0));
      if (local_120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_120);
      }
      bVar4 = QPDFObjectHandle::isStream(this_01);
      if (!bVar4) {
        local_1b0._M_dataplus._M_p = (pointer)QPDFObjectHandle::getObjGen(this_01);
        pmVar6 = std::
                 map<QPDFObjGen,_QPDFObjectHandle,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
                 ::operator[](&obj_copier->object_map,(key_type *)&local_1b0);
        local_138.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (pmVar6->super_BaseHandle).obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_138.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             (pmVar6->super_BaseHandle).obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        if (local_138.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_138.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (local_138.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_138.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (local_138.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi)->_M_use_count + 1;
          }
        }
        local_148.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)local_b0._0_8_;
        local_148.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_;
        if ((_Base_ptr)local_b0._8_8_ != (_Base_ptr)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)(local_b0._8_8_ + 8) = *(int *)(local_b0._8_8_ + 8) + 1;
            UNLOCK();
          }
          else {
            *(int *)(local_b0._8_8_ + 8) = *(int *)(local_b0._8_8_ + 8) + 1;
          }
        }
        replaceReserved((QPDF *)foreign,&local_138,&local_148);
        if (local_148.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_148.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
        if (local_138.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_138.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
      }
      if ((_Base_ptr)local_b0._8_8_ != (_Base_ptr)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_);
      }
      this_01 = this_01 + 1;
    } while (this_01 != pQVar2);
  }
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::clear(&obj_copier->to_copy);
  local_f8 = QPDFObjectHandle::getObjGen(local_100);
  cVar7 = std::
          _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
          ::find((_Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
                  *)obj_copier,&local_f8);
  if ((_Rb_tree_header *)cVar7._M_node !=
      &(obj_copier->object_map)._M_t._M_impl.super__Rb_tree_header) {
    local_b0._0_8_ = QPDFObjectHandle::getObjGen(local_100);
    pmVar6 = std::
             map<QPDFObjGen,_QPDFObjectHandle,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
             ::operator[](&obj_copier->object_map,(key_type *)local_b0);
    *(Members **)
     &(local_190->value).
      super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
      .
      super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
      .
      super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
      .
      super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
      .
      super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
      .
      super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
         = (Members *)
           (pmVar6->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
    p_Var3 = (pmVar6->super_BaseHandle).obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
     ((long)&(local_190->value).
             super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
     + 8) = p_Var3;
    _Var11._M_pi = extraout_RDX;
    peVar12 = local_190;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
    goto LAB_0013b6e8;
  }
  plVar8 = (long *)(**(code **)(**(long **)((long)*(
                                                  __uniq_ptr_data<QPDF::Members,_std::default_delete<QPDF::Members>,_true,_true>
                                                  *)local_108 + 0xb0) + 0x18))();
  local_d0[0] = (_Base_ptr)local_c0;
  std::__cxx11::string::_M_construct<char*>((string *)local_d0,*plVar8,plVar8[1] + *plVar8);
  plVar8 = (long *)std::__cxx11::string::append((char *)local_d0);
  puVar10 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar10) {
    local_178 = *puVar10;
    lStack_170 = plVar8[3];
    local_188 = &local_178;
  }
  else {
    local_178 = *puVar10;
    local_188 = (ulong *)*plVar8;
  }
  local_180 = plVar8[1];
  *plVar8 = (long)puVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  QPDFObjGen::unparse_abi_cxx11_(&local_168,&local_f8,' ');
  uVar13 = 0xf;
  if (local_188 != &local_178) {
    uVar13 = local_178;
  }
  if (uVar13 < local_168._M_string_length + local_180) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      uVar14 = local_168.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_168._M_string_length + local_180) goto LAB_0013b568;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_168,0,(char *)0x0,(ulong)local_188);
  }
  else {
LAB_0013b568:
    puVar9 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_188,(ulong)local_168._M_dataplus._M_p);
  }
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  psVar1 = puVar9 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_1b0.field_2._M_allocated_capacity = *psVar1;
    local_1b0.field_2._8_8_ = puVar9[3];
  }
  else {
    local_1b0.field_2._M_allocated_capacity = *psVar1;
    local_1b0._M_dataplus._M_p = (pointer)*puVar9;
  }
  local_1b0._M_string_length = puVar9[1];
  *puVar9 = psVar1;
  puVar9[1] = 0;
  *(undefined1 *)psVar1 = 0;
  offset = QPDFObjectHandle::getParsedOffset(local_100);
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f0,
             "unexpected reference to /Pages object while copying foreign object; replacing with null"
             ,"");
  filename = (string *)
             (**(code **)(*(long *)(foreign->super_BaseHandle).obj.
                                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                                   [1].og + 0x18))();
  QPDFExc::QPDFExc((QPDFExc *)local_b0,qpdf_e_damaged_pdf,filename,&local_1b0,offset,&local_f0,true)
  ;
  warn((QPDF *)foreign,(QPDFExc *)local_b0);
  QPDFExc::~QPDFExc((QPDFExc *)local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  if (local_188 != &local_178) {
    operator_delete(local_188,local_178 + 1);
  }
  peVar12 = local_190;
  if (local_d0[0] != (_Base_ptr)local_c0) {
    operator_delete(local_d0[0],(ulong)((long)&local_c0[0]->_M_color + 1));
  }
  QVar15 = QPDFObjectHandle::newNull();
  _Var11._M_pi = QVar15.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
LAB_0013b6e8:
  QVar15.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = _Var11._M_pi;
  QVar15.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar12;
  return (QPDFObjectHandle)
         QVar15.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDF::copyForeignObject(QPDFObjectHandle foreign)
{
    // Here's an explanation of what's going on here.
    //
    // A QPDFObjectHandle that is an indirect object has an owning QPDF. The object ID and
    // generation refers to an object in the owning QPDF. When we copy the QPDFObjectHandle from a
    // foreign QPDF into the local QPDF, we have to replace all indirect object references with
    // references to the corresponding object in the local file.
    //
    // To do this, we maintain mappings from foreign object IDs to local object IDs for each foreign
    // QPDF that we are copying from. The mapping is stored in an ObjCopier, which contains a
    // mapping from the foreign ObjGen to the local QPDFObjectHandle.
    //
    // To copy, we do a deep traversal of the foreign object with loop detection to discover all
    // indirect objects that are encountered, stopping at page boundaries. Whenever we encounter an
    // indirect object, we check to see if we have already created a local copy of it. If not, we
    // allocate a "reserved" object (or, for a stream, just a new stream) and store in the map the
    // mapping from the foreign object ID to the new object. While we
    // do this, we keep a list of objects to copy.
    //
    // Once we are done with the traversal, we copy all the objects that we need to copy. However,
    // the copies will contain indirect object IDs that refer to objects in the foreign file. We
    // need to replace them with references to objects in the local file. This is what
    // replaceForeignIndirectObjects does. Once we have created a copy of the foreign object with
    // all the indirect references replaced with new ones in the local context, we can replace the
    // local reserved object with the copy. This mechanism allows us to copy objects with circular
    // references in any order.

    // For streams, rather than copying the objects, we set up the stream data to pull from the
    // original stream by using a stream data provider. This is done in a manner that doesn't
    // require the original QPDF object but may require the original source of the stream data with
    // special handling for immediate_copy_from. This logic is also in
    // replaceForeignIndirectObjects.

    // Note that we explicitly allow use of copyForeignObject on page objects. It is a documented
    // use case to copy pages this way if the intention is to not update the pages tree.
    if (!foreign.isIndirect()) {
        QTC::TC("qpdf", "QPDF copyForeign direct");
        throw std::logic_error("QPDF::copyForeign called with direct object handle");
    }
    QPDF& other = foreign.getQPDF();
    if (&other == this) {
        QTC::TC("qpdf", "QPDF copyForeign not foreign");
        throw std::logic_error("QPDF::copyForeign called with object from this QPDF");
    }

    ObjCopier& obj_copier = m->object_copiers[other.m->unique_id];
    if (!obj_copier.visiting.empty()) {
        throw std::logic_error(
            "obj_copier.visiting is not empty at the beginning of copyForeignObject");
    }

    // Make sure we have an object in this file for every referenced object in the old file.
    // obj_copier.object_map maps foreign QPDFObjGen to local objects.  For everything new that we
    // have to copy, the local object will be a reservation, unless it is a stream, in which case
    // the local object will already be a stream.
    reserveObjects(foreign, obj_copier, true);

    if (!obj_copier.visiting.empty()) {
        throw std::logic_error("obj_copier.visiting is not empty after reserving objects");
    }

    // Copy any new objects and replace the reservations.
    for (auto& to_copy: obj_copier.to_copy) {
        QPDFObjectHandle copy = replaceForeignIndirectObjects(to_copy, obj_copier, true);
        if (!to_copy.isStream()) {
            QPDFObjGen og(to_copy.getObjGen());
            replaceReserved(obj_copier.object_map[og], copy);
        }
    }
    obj_copier.to_copy.clear();

    auto og = foreign.getObjGen();
    if (!obj_copier.object_map.count(og)) {
        warn(damagedPDF(
            other.getFilename() + " object " + og.unparse(' '),
            foreign.getParsedOffset(),
            "unexpected reference to /Pages object while copying foreign object; replacing with "
            "null"));
        return QPDFObjectHandle::newNull();
    }
    return obj_copier.object_map[foreign.getObjGen()];
}